

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_adaptive_code.hpp
# Opt level: O0

void __thiscall
LDPC4QKD::RateAdaptiveCode<unsigned_int>::recompute_pos_vn_cn
          (RateAdaptiveCode<unsigned_int> *this,size_t n_line_combs)

{
  pointer *this_00;
  bool bVar1;
  size_type sVar2;
  runtime_error *this_01;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar3;
  const_reference pvVar4;
  reference this_02;
  ulong uVar5;
  reference pvVar6;
  reference puVar7;
  uint *vn;
  iterator __end0;
  iterator __begin0;
  value_type *__range4;
  undefined1 auStack_138 [4];
  uint i_2;
  pointer puStack_130;
  pointer local_128;
  ulong local_120;
  size_t i_1;
  size_t j;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_108;
  const_iterator local_100;
  uint *local_f8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_f0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_e8;
  const_iterator local_e0;
  uint *local_d8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_d0;
  uint *local_c8;
  uint *local_c0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_b8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_b0;
  const_iterator local_a8;
  uint *local_a0;
  uint *local_98;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_90;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_88;
  const_iterator local_80;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_78;
  value_type *curr_varn_vec;
  size_t i;
  size_t start_of_ra_part;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  pos_varn_nora;
  size_t n_line_combs_local;
  RateAdaptiveCode<unsigned_int> *this_local;
  
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->rows_to_combine);
  if (n_line_combs << 1 <= sVar2) {
    this->n_ra_rows = this->n_mother_rows - n_line_combs;
    sVar2 = this->n_ra_rows;
    pos_varn_nora.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = &pos_varn_nora.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::assign(&this->pos_varn,sVar2,(value_type *)this_00);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &pos_varn_nora.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (n_line_combs == 0) {
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator=(&this->pos_varn,&this->mother_pos_varn);
    }
    else {
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)&start_of_ra_part,&this->mother_pos_varn);
      i = this->n_mother_rows + n_line_combs * -2;
      for (curr_varn_vec = (value_type *)0x0; curr_varn_vec < n_line_combs;
          curr_varn_vec =
               (value_type *)
               ((long)&(curr_varn_vec->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1)) {
        pvVar3 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                 std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](&this->pos_varn,
                              (long)&(curr_varn_vec->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_start + i);
        local_78 = pvVar3;
        local_88._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar3);
        __gnu_cxx::
        __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
        ::__normal_iterator<unsigned_int*>
                  ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    *)&local_80,&local_88);
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->rows_to_combine,(long)curr_varn_vec * 2);
        pvVar6 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)&start_of_ra_part,(ulong)*pvVar4);
        local_90._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar6);
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->rows_to_combine,(long)curr_varn_vec * 2);
        pvVar6 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)&start_of_ra_part,(ulong)*pvVar4);
        local_98 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar6);
        local_a0 = (uint *)std::vector<unsigned_int,std::allocator<unsigned_int>>::
                           insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                                     (pvVar3,local_80,local_90,
                                      (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       )local_98);
        pvVar3 = local_78;
        local_b0._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
        __gnu_cxx::
        __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
        ::__normal_iterator<unsigned_int*>
                  ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    *)&local_a8,&local_b0);
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->rows_to_combine,(long)curr_varn_vec * 2 + 1);
        pvVar6 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)&start_of_ra_part,(ulong)*pvVar4);
        local_b8._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar6);
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->rows_to_combine,(long)curr_varn_vec * 2 + 1);
        pvVar6 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)&start_of_ra_part,(ulong)*pvVar4);
        local_c0 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar6);
        local_c8 = (uint *)std::vector<unsigned_int,std::allocator<unsigned_int>>::
                           insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                                     (pvVar3,local_a8,local_b8,
                                      (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       )local_c0);
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->rows_to_combine,(long)curr_varn_vec * 2);
        pvVar6 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)&start_of_ra_part,(ulong)*pvVar4);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(pvVar6);
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->rows_to_combine,(long)curr_varn_vec * 2 + 1);
        pvVar6 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)&start_of_ra_part,(ulong)*pvVar4);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(pvVar6);
        local_d0._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
        local_d8 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      local_78);
        std::
        sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  (local_d0,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             )local_d8);
        pvVar3 = local_78;
        local_f0._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
        local_f8 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      local_78);
        local_e8 = std::
                   unique<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                             (local_f0,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                        )local_f8);
        __gnu_cxx::
        __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
        ::__normal_iterator<unsigned_int*>
                  ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    *)&local_e0,&local_e8);
        local_108._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
        __gnu_cxx::
        __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
        ::__normal_iterator<unsigned_int*>
                  ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    *)&local_100,&local_108);
        j = (size_t)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar3,
                               local_e0,local_100);
      }
      i_1 = 0;
      for (local_120 = 0; local_120 < i; local_120 = local_120 + 1) {
        while( true ) {
          pvVar6 = std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 *)&start_of_ra_part,i_1);
          bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(pvVar6);
          if (!bVar1) break;
          i_1 = i_1 + 1;
        }
        pvVar6 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)&start_of_ra_part,i_1);
        this_02 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[](&this->pos_varn,local_120);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(this_02,pvVar6);
        i_1 = i_1 + 1;
      }
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)&start_of_ra_part);
    }
    sVar2 = this->n_cols;
    _auStack_138 = (pointer)0x0;
    puStack_130 = (pointer)0x0;
    local_128 = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_138);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::assign(&this->pos_checkn,sVar2,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_138);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_138);
    for (__range4._4_4_ = 0; uVar5 = (ulong)__range4._4_4_,
        sVar2 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::size(&this->pos_varn), uVar5 < sVar2; __range4._4_4_ = __range4._4_4_ + 1) {
      pvVar6 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&this->pos_varn,(ulong)__range4._4_4_);
      __end0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar6);
      vn = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar6);
      while (bVar1 = __gnu_cxx::
                     operator==<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               (&__end0,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                         *)&vn), ((bVar1 ^ 0xffU) & 1) != 0) {
        puVar7 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end0);
        pvVar6 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](&this->pos_checkn,(ulong)*puVar7);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (pvVar6,(value_type_conflict *)((long)&__range4 + 4));
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end0);
      }
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_01,"Requested rate not supported. Not enough line combinations specified.");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void recompute_pos_vn_cn(std::size_t n_line_combs) {
            if (rows_to_combine.size() < 2 * n_line_combs) {
                throw std::runtime_error("Requested rate not supported. Not enough line combinations specified.");
            }

            {   // recompute pos_varn ---------------------------------------------------------------
                // TODO check if this assumes full rank of H (should have that anyway)
                // This uses different size vectors for nodes with different degrees.
                // Alternatively, one could set the sizes to be the same (set them to the largest check node degree)

                n_ra_rows = n_mother_rows - n_line_combs;
                pos_varn.assign(n_ra_rows, std::vector<idx_t>{});

                if (n_line_combs == 0) {
                    pos_varn = mother_pos_varn;
                } else {
                    // Make temporary copy of `mother_pos_varn`
                    std::vector<std::vector<idx_t>> pos_varn_nora{mother_pos_varn};

                    // put results of combined lines at the back of the new LDPC code
                    const auto start_of_ra_part = n_mother_rows - 2 * n_line_combs;

                    for (std::size_t i{}; i < n_line_combs; ++i) {
                        auto &curr_varn_vec = pos_varn[start_of_ra_part + i];
                        curr_varn_vec.insert(curr_varn_vec.end(),
                                             pos_varn_nora[rows_to_combine[2 * i]].begin(),
                                             pos_varn_nora[rows_to_combine[2 * i]].end());
                        curr_varn_vec.insert(curr_varn_vec.end(),
                                             pos_varn_nora[rows_to_combine[2 * i + 1]].begin(),
                                             pos_varn_nora[rows_to_combine[2 * i + 1]].end());

                        pos_varn_nora[rows_to_combine[2 * i]].clear();
                        pos_varn_nora[rows_to_combine[2 * i + 1]].clear();

                        // TODO speed up this part by producing the rate adaption as unique positions and already sorted
                        std::sort(curr_varn_vec.begin(), curr_varn_vec.end());
                        curr_varn_vec.erase(std::unique(curr_varn_vec.begin(), curr_varn_vec.end()),
                                            curr_varn_vec.end());
                    }

                    std::size_t j{};

                    // put the remaining lines that were not rate adapted at the front of the new LDPC code.
                    for (std::size_t i{}; i < start_of_ra_part; ++i) {
                        while (pos_varn_nora[j].empty()) {
                            j++;
                        }
                        pos_varn[i] = std::move(pos_varn_nora[j]);
                        j++;
                    }

                }
            }  // end recompute pos_varn

            {   // recompute pos_checkn -------------------------------------------------------------------------------
                // Now compute pos_checkn from the previously computed pos_varn.
                // These arrays contain the same information.
                pos_checkn.assign(n_cols, std::vector<idx_t>{});

                for (idx_t i{}; i < pos_varn.size(); ++i) {
                    for (auto &vn : pos_varn[i]) {
                        pos_checkn[vn].push_back(i);
                    }
                }
            }  // end recompute pos_checkn
        }